

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request,uint16_t *compress_algos,
              size_t num_compress_algos)

{
  ptls_buffer_t *buf;
  ptls_key_schedule_t *sched;
  size_t sVar1;
  st_ptls_sign_certificate_t *psVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ptls_emit_certificate_t *ppVar7;
  size_t sVar8;
  bool bVar9;
  ptls_iovec_t pVar10;
  uint16_t algo;
  undefined1 local_149;
  ptls_buffer_t *local_148;
  undefined2 local_13a;
  size_t local_138;
  size_t local_130;
  char *local_128;
  st_ptls_signature_algorithms_t *local_120;
  uint8_t data [226];
  
  if (signature_algorithms->count == 0) {
    iVar3 = 0x6d;
  }
  else {
    ppVar7 = tls->ctx->emit_certificate;
    local_128 = context_string;
    local_120 = signature_algorithms;
    if (ppVar7 == (st_ptls_emit_certificate_t *)0x0) {
      ppVar7 = &send_certificate_and_certificate_verify::default_emit_certificate;
    }
    while( true ) {
      iVar3 = (*ppVar7->cb)(ppVar7,tls,emitter,tls->key_schedule,context,push_status_request,
                            compress_algos,num_compress_algos);
      if (iVar3 != 0x20a) break;
      bVar9 = ppVar7 == &send_certificate_and_certificate_verify::default_emit_certificate;
      ppVar7 = &send_certificate_and_certificate_verify::default_emit_certificate;
      if (bVar9) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xa7d,
                      "int send_certificate_and_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, const char *, int, const uint16_t *, size_t)"
                     );
      }
    }
    if (iVar3 == 0) {
      if (tls->ctx->sign_certificate == (ptls_sign_certificate_t *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (*emitter->begin_message)(emitter);
        if (iVar3 == 0) {
          buf = emitter->buf;
          sched = tls->key_schedule;
          sVar1 = buf->off;
          local_149 = 0xf;
          iVar3 = ptls_buffer__do_pushv(buf,&local_149,1);
          if (iVar3 == 0) {
            iVar3 = ptls_buffer__do_pushv(buf,"",3);
            if (iVar3 == 0) {
              sVar8 = buf->off;
              local_148 = emitter->buf;
              local_130 = local_148->off;
              local_13a = 0;
              iVar3 = ptls_buffer__do_pushv(local_148,&local_13a,2);
              if (iVar3 == 0) {
                iVar3 = ptls_buffer__do_pushv(local_148,"",2);
                if (iVar3 == 0) {
                  local_138 = local_148->off;
                  sVar4 = build_certificate_verify_signdata(data,tls->key_schedule,local_128);
                  psVar2 = tls->ctx->sign_certificate;
                  pVar10.len = sVar4;
                  pVar10.base = data;
                  iVar3 = (*psVar2->cb)(psVar2,tls,&algo,local_148,pVar10,local_120->list,
                                        local_120->count);
                  if (iVar3 == 0) {
                    local_148->base[local_130] = algo._1_1_;
                    local_148->base[local_130 + 1] = (uint8_t)algo;
                    lVar6 = local_148->off - local_138;
                    local_148->base[local_138 - 2] = (uint8_t)((ulong)lVar6 >> 8);
                    local_148->base[local_138 - 1] = (uint8_t)lVar6;
                    uVar5 = buf->off - sVar8;
                    for (lVar6 = 0x10; lVar6 != -8; lVar6 = lVar6 + -8) {
                      buf->base[sVar8 - 3] = (uint8_t)(uVar5 >> ((byte)lVar6 & 0x3f));
                      sVar8 = sVar8 + 1;
                    }
                    if (sched != (ptls_key_schedule_t *)0x0) {
                      ptls__key_schedule_update_hash(sched,buf->base + sVar1,buf->off - sVar1);
                    }
                    iVar3 = (*emitter->commit_message)(emitter);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request,
                                                   const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
            ptls_buffer_t *sendbuf = emitter->buf;
            size_t algo_off = sendbuf->off;
            ptls_buffer_push16(sendbuf, 0); /* filled in later */
            ptls_buffer_push_block(sendbuf, 2, {
                uint16_t algo;
                uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                          ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                          signature_algorithms->count)) != 0) {
                    goto Exit;
                }
                sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                sendbuf->base[algo_off + 1] = (uint8_t)algo;
            });
        });
    }

Exit:
    return ret;
}